

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VGetArrayPointer(N_Vector W,sunindextype local_length,int myid)

{
  undefined8 *puVar1;
  uint in_EDX;
  N_Vector in_RDI;
  double dVar2;
  double dVar3;
  N_Vector unaff_retaddr;
  sunrealtype *Wdata;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if (in_RDI->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d missing required operations\n",
           (ulong)in_EDX);
    iVar4 = 1;
  }
  else {
    dVar2 = get_time();
    puVar1 = (undefined8 *)N_VGetArrayPointer(in_RDI);
    dVar3 = get_time();
    *puVar1 = 0x3ff0000000000000;
    iVar4 = has_data(in_RDI);
    if (iVar4 == 0) {
      printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)in_EDX);
      printf("    Vector data == NULL \n\n");
      iVar4 = 1;
    }
    else {
      N_VConst(0xbfe0000000000000,in_RDI);
      iVar4 = check_ans((sunrealtype)Wdata,unaff_retaddr,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar4 == 0) {
        if (in_EDX == 0) {
          printf("PASSED test -- N_VGetArrayPointer \n");
        }
        dVar2 = max_time(in_RDI,dVar3 - dVar2);
        if (print_time != 0) {
          printf("%s Time: %22.15e\n\n",dVar2,"N_VGetArrayPointer");
        }
        iVar4 = 0;
      }
      else {
        printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)in_EDX);
        printf("    Failed N_VConst check \n\n");
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int Test_N_VGetArrayPointer(N_Vector W, sunindextype local_length, int myid)
{
  int failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype* Wdata;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL)
  {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d missing required "
           "operations\n",
           myid);
    return (1);
  }

  /* get vector data, time it and set it to NULL */
  start_time = get_time();
  Wdata      = N_VGetArrayPointer(W);
  stop_time  = get_time();
  Wdata[0]   = ONE; /* Do something with pointer to surpress warning */

  /* check vector data */
  if (!has_data(W))
  {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Vector data == NULL \n\n");
    return (1);
  }

  N_VConst(NEG_HALF, W);
  failure = check_ans(NEG_HALF, W, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Failed N_VConst check \n\n");
    return (1);
  }

  if (myid == 0) { printf("PASSED test -- N_VGetArrayPointer \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VGetArrayPointer", maxt);

  return (0);
}